

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToFixed
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  long lVar1;
  bool bVar2;
  DoubleToStringConverter *in_RDX;
  DtoaMode in_ESI;
  StringBuilder *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  bool unique_zero;
  int kDecimalRepCapacity;
  double kFirstNonFixed;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [161];
  double in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int length;
  DoubleToStringConverter *this_00;
  int in_stack_ffffffffffffff18;
  bool local_cd;
  undefined1 local_b8 [88];
  int *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (DoubleToStringConverter *)0x4c63e9e4e4c2f344;
  Double::Double((Double *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
  bVar2 = Double::IsSpecial((Double *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0))
  ;
  if (bVar2) {
    local_cd = HandleSpecialValues(this_00,(double)CONCAT44(in_stack_ffffffffffffff04,
                                                            in_stack_ffffffffffffff00),in_RDI);
  }
  else if ((int)in_ESI < 0x65) {
    if ((1e+60 <= in_XMM0_Qa) || (in_XMM0_Qa <= -1e+60)) {
      local_cd = false;
    }
    else {
      length = 0xa1;
      memset(local_b8,0xaa,0xa1);
      DoubleToAscii(in_XMM0_Qa,in_ESI,in_stack_ffffffffffffff18,(char *)in_RDX,
                    (int)((ulong)this_00 >> 0x20),(bool *)CONCAT44(length,in_stack_ffffffffffffff00)
                    ,(int *)in_RDI,in_stack_ffffffffffffffa0);
      CreateDecimalRepresentation
                (in_RDX,(char *)this_00,length,
                 CONCAT13((*(uint *)in_RDI & 8) != 0,(int3)in_stack_ffffffffffffff00),
                 (int)((ulong)in_RDI >> 0x20),
                 (StringBuilder *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      local_cd = true;
    }
  }
  else {
    local_cd = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_cd;
}

Assistant:

bool DoubleToStringConverter::ToFixed(double value,
                                      int requested_digits,
                                      StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(kMaxFixedDigitsBeforePoint == 60);
  const double kFirstNonFixed = 1e60;

  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits > kMaxFixedDigitsAfterPoint) return false;
  if (value >= kFirstNonFixed || value <= -kFirstNonFixed) return false;

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add space for the '\0' byte.
  const int kDecimalRepCapacity =
      kMaxFixedDigitsBeforePoint + kMaxFixedDigitsAfterPoint + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;
  DoubleToAscii(value, FIXED, requested_digits,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                              requested_digits, result_builder);
  return true;
}